

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::SharedCodeGenerator
          (SharedCodeGenerator *this,FileDescriptor *file,Options *options)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ClassNameResolver *this_00;
  
  this_00 = (ClassNameResolver *)operator_new(0x30);
  ClassNameResolver::ClassNameResolver(this_00);
  (this->name_resolver_).ptr_ = this_00;
  this->file_ = file;
  bVar2 = options->generate_mutable_code;
  bVar3 = options->generate_shared_code;
  bVar4 = options->enforce_lite;
  (this->options_).generate_immutable_code = options->generate_immutable_code;
  (this->options_).generate_mutable_code = bVar2;
  (this->options_).generate_shared_code = bVar3;
  (this->options_).enforce_lite = bVar4;
  (this->options_).annotate_code = options->annotate_code;
  (this->options_).annotation_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_list_file.field_2;
  pcVar1 = (options->annotation_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_list_file,pcVar1,
             pcVar1 + (options->annotation_list_file)._M_string_length);
  (this->options_).output_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).output_list_file.field_2;
  pcVar1 = (options->output_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).output_list_file,pcVar1,
             pcVar1 + (options->output_list_file)._M_string_length);
  return;
}

Assistant:

SharedCodeGenerator::SharedCodeGenerator(const FileDescriptor* file,
                                         const Options& options)
    : name_resolver_(new ClassNameResolver), file_(file), options_(options) {}